

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* testing::internal::ActionResultHolder<std::__cxx11::string>::
  PerformDefaultAction<std::__cxx11::string(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
            (FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
             *func_mocker,ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  Result local_60;
  char *local_40;
  size_type local_38;
  char local_30 [8];
  undefined8 uStack_28;
  
  this = (ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)operator_new(0x28);
  FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::PerformDefaultAction(&local_60,func_mocker,args,call_description);
  local_40 = local_30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == &local_60.field_2) {
    uStack_28 = local_60.field_2._8_8_;
  }
  else {
    local_40 = local_60._M_dataplus._M_p;
  }
  local_38 = local_60._M_string_length;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ActionResultHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ActionResultHolder(this,(Wrapper *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return this;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }